

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlAttrValueSpec::PrettyPrint
          (GdlAttrValueSpec *this,GrcManager *pcman,ostream *strmOut,bool fXml,bool *param_5,
          bool *param_6,bool *param_7,size_t param_8)

{
  ostream *poVar1;
  byte in_CL;
  GrcSymbolTableEntry *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  string local_80 [48];
  string local_50 [55];
  byte local_19;
  GrcSymbolTableEntry *this_00;
  
  local_19 = in_CL & 1;
  this_00 = in_RDX;
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(in_RDX);
  std::operator<<((ostream *)in_RDX,local_50);
  std::__cxx11::string::~string(local_50);
  poVar1 = std::operator<<((ostream *)this_00," ");
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(this_00);
  poVar1 = std::operator<<(poVar1,local_80);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string(local_80);
  (**(code **)(**(long **)(in_RDI + 0x38) + 0xe8))
            (*(long **)(in_RDI + 0x38),in_RSI,this_00,local_19 & 1,0);
  std::operator<<((ostream *)this_00,"; ");
  return;
}

Assistant:

void GdlAttrValueSpec::PrettyPrint(GrcManager * pcman, std::ostream & strmOut, bool fXml,
	bool * /*pfAtt*/, bool * /*pfAttAt*/, bool * /*pfAttWith*/, size_t /*cpavs*/)
{
	strmOut << m_psymName->FullAbbrev();
	strmOut << " " << m_psymOperator->FullAbbrev() << " ";
	m_pexpValue->PrettyPrint(pcman, strmOut, fXml);
	strmOut << "; ";
}